

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_ObjRemoveDup(Acb_Ntk_t *p,int iObj,int i,int j)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  char *__assertion;
  ulong uVar15;
  int *pFanins;
  word *pwVar16;
  bool bVar17;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    uVar2 = (p->vObjTruth).nSize;
    if (0 < (int)uVar2) {
      if (uVar2 <= (uint)iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                      ,0xad,"void Acb_ObjRemoveDup(Acb_Ntk_t *, int, int, int)");
      }
      if (iObj < (p->vObjFans).nSize) {
        piVar3 = (p->vObjFans).pArray;
        iVar12 = piVar3[(uint)iObj];
        if ((-1 < (long)iVar12) && (iVar12 < (p->vFanSto).nSize)) {
          piVar4 = (p->vFanSto).pArray;
          piVar1 = piVar4 + iVar12;
          lVar14 = (long)j;
          if (piVar1[(long)i + 1] != piVar1[lVar14 + 1]) {
            __assert_fail("Acb_ObjFanin(p, iObj, i) == Acb_ObjFanin(p, iObj, j)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                          ,0xae,"void Acb_ObjRemoveDup(Acb_Ntk_t *, int, int, int)");
          }
          if ((5 < (uint)i) || (5 < (uint)j)) {
            __assert_fail("iVar >= 0 && iVar < 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                          ,0x240,"word Abc_Tt6Cofactor0(word, int)");
          }
          pwVar5 = (p->vObjTruth).pArray;
          uVar8 = pwVar5[(uint)iObj];
          uVar15 = s_Truths6Neg[(uint)i] & uVar8;
          bVar9 = (byte)(1 << ((byte)i & 0x1f));
          uVar15 = (uVar15 << (bVar9 & 0x3f) | uVar15) & s_Truths6Neg[(uint)j];
          bVar10 = (byte)(1 << ((byte)j & 0x1f));
          uVar15 = uVar15 << (bVar10 & 0x3f) | uVar15;
          uVar8 = uVar8 & s_Truths6[(uint)i];
          uVar8 = (uVar8 >> (bVar9 & 0x3f) | uVar8) & s_Truths6[(uint)j];
          uVar15 = ((uVar8 >> (bVar10 & 0x3f) | uVar8) ^ uVar15) & s_Truths6[(uint)i] ^ uVar15;
          if (((uVar15 >> (bVar10 & 0x3f) ^ uVar15) & s_Truths6Neg[(uint)j]) != 0) {
            __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                          ,0x5d4,"word Abc_Tt6RemoveVar(word, int)");
          }
          if (j != 5) {
            pwVar16 = s_PMasks[lVar14] + 2;
            iVar12 = j;
            lVar13 = lVar14;
            do {
              lVar13 = lVar13 + 1;
              bVar9 = (byte)(1 << ((byte)iVar12 & 0x1f));
              uVar15 = (uVar15 & *pwVar16) >> (bVar9 & 0x3f) |
                       (pwVar16[-1] & uVar15) << (bVar9 & 0x3f) |
                       (*(word (*) [3])(pwVar16 + -2))[0] & uVar15;
              iVar12 = iVar12 + 1;
              pwVar16 = pwVar16 + 3;
            } while ((int)lVar13 != 5);
          }
          pwVar5[(uint)iObj] = uVar15;
          lVar11 = (long)*piVar1 + -1;
          *piVar1 = (int)lVar11;
          lVar13 = lVar14;
          if (j < (int)lVar11) {
            do {
              piVar1[lVar13 + 1] = piVar1[lVar13 + 2];
              lVar13 = lVar13 + 1;
              lVar11 = (long)*piVar1;
            } while (lVar13 < lVar11);
          }
          piVar1[lVar11 + 1] = -1;
          if ((p->vFanouts).nSize <= iObj) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          if ((p->vObjFans).nSize <= iObj) goto LAB_00381bbc;
          iVar12 = piVar3[(uint)iObj];
          if ((-1 < (long)iVar12) && (iVar12 < (p->vFanSto).nSize)) {
            pVVar6 = (p->vFanouts).pArray;
            iVar7 = pVVar6[(uint)iObj].nSize;
            if ((long)iVar7 < 1) {
              if (iVar7 != 0) {
                __assert_fail("i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x3e5,"int Vec_IntRemove(Vec_Int_t *, int)");
              }
            }
            else {
              piVar3 = pVVar6[(uint)iObj].pArray;
              lVar13 = 1;
              do {
                if (piVar3[lVar13 + -1] == piVar4[(long)iVar12 + lVar14 + 1]) {
                  if ((int)lVar13 < iVar7) {
                    do {
                      piVar3[lVar13 + -1] = piVar3[lVar13];
                      lVar13 = lVar13 + 1;
                      iVar7 = pVVar6[(uint)iObj].nSize;
                    } while ((int)lVar13 < iVar7);
                  }
                  pVVar6[(uint)iObj].nSize = iVar7 + -1;
                  break;
                }
                bVar17 = lVar13 != iVar7;
                lVar13 = lVar13 + 1;
              } while (bVar17);
            }
            do {
              iVar12 = Acb_ObjSuppMin_int(p,iObj);
            } while (iVar12 != 0);
            return;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
LAB_00381bbc:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_ObjRemoveDup( Acb_Ntk_t * p, int iObj, int i, int j )
{
    word c00, c11, uTruthNew, uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFanin(p, iObj, i) == Acb_ObjFanin(p, iObj, j) );
    c00 = Abc_Tt6Cofactor0( Abc_Tt6Cofactor0(uTruth, i), j );
    c11 = Abc_Tt6Cofactor1( Abc_Tt6Cofactor1(uTruth, i), j );
    uTruthNew = (~s_Truths6[i] & c00) | (s_Truths6[i] & c11);
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthNew, j) );
    Acb_ObjDeleteFaninIndex( p, iObj, j );
    Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iObj), Acb_ObjFanin(p, iObj, j) );
    Acb_ObjSuppMin( p, iObj );
}